

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O3

void __thiscall settings_tests::Merge::test_method(Merge *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  Action AVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  system_error *psVar10;
  int *piVar11;
  error_category *peVar12;
  mapped_type *pmVar13;
  mapped_type *this_00;
  size_t sVar14;
  long lVar15;
  mapped_type *pmVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  uint *puVar18;
  long lVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  char *pcVar21;
  pointer pUVar22;
  iterator in_R8;
  iterator pvVar23;
  long lVar24;
  long in_FS_OFFSET;
  bool bVar25;
  const_string file;
  Span<unsigned_char> output;
  Span<const_unsigned_char> s;
  const_string file_00;
  error_code __ec;
  const_string msg;
  const_string msg_00;
  check_type cVar26;
  FILE *local_300;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 local_2a8 [20];
  int value_suffix;
  char *local_290;
  char *local_288;
  anon_class_24_3_f552ebe0 push_values;
  undefined2 local_264;
  char local_262 [2];
  string local_260;
  CHash256 out_sha;
  Action local_1d8 [4];
  Action local_1c8 [4];
  undefined1 local_1b8 [16];
  undefined1 auStack_1a8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<UniValue,_std::allocator<UniValue>_> local_150;
  string out_sha_hex;
  Settings settings;
  uchar out_sha_bytes [32];
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&out_sha.sha);
  pcVar9 = getenv("SETTINGS_MERGE_TEST_OUT");
  if (pcVar9 == (char *)0x0) {
    local_300 = (FILE *)0x0;
  }
  else {
    __str._M_dataplus._M_p = pcVar9;
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              ((path *)&settings,(char **)&__str,auto_format);
    local_300 = fsbridge::fopen((char *)&settings,"w");
    std::filesystem::__cxx11::path::~path((path *)&settings);
    if (local_300 == (FILE *)0x0) {
      psVar10 = (system_error *)__cxa_allocate_exception(0x20);
      piVar11 = __errno_location();
      iVar8 = *piVar11;
      peVar12 = (error_category *)std::_V2::generic_category();
      std::system_error::system_error(psVar10,iVar8,peVar12,"fopen failed");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
        __cxa_throw(psVar10,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      goto LAB_0062bb4f;
    }
  }
  ChainTypeToString_abi_cxx11_(&local_260,MAIN);
  local_1d8[2] = 0;
  local_1d8[0] = END;
  local_1d8[1] = END;
  paVar1 = &__str.field_2;
  lVar19 = 0;
  iVar8 = -1;
  do {
    do {
      iVar7 = iVar8;
      iVar8 = *(int *)((long)local_1d8 + lVar19);
      bVar25 = iVar8 - 3U < 0xfffffffe;
      lVar19 = lVar19 + 4;
      in_R8 = (iterator)
              CONCAT71((int7)((ulong)in_R8 >> 8),(lVar19 == 0xc || iVar8 == iVar7) || bVar25);
    } while ((lVar19 != 0xc && iVar8 != iVar7) && !bVar25);
    if (iVar8 != iVar7) {
      local_1c8[2] = 0;
      local_1c8[0] = END;
      local_1c8[1] = END;
      lVar19 = 0;
      iVar8 = -1;
      do {
        do {
          iVar7 = iVar8;
          iVar8 = *(int *)((long)local_1c8 + lVar19);
          bVar25 = iVar8 - 5U < 0xfffffffc;
          lVar19 = lVar19 + 4;
          in_R8 = (iterator)
                  CONCAT71((int7)((ulong)in_R8 >> 8),(lVar19 == 0xc || iVar8 == iVar7) || bVar25);
        } while ((lVar19 != 0xc && iVar8 != iVar7) && !bVar25);
        if (iVar8 != iVar7) {
          local_262[0] = '\0';
          local_262[1] = '\x01';
          lVar19 = 0;
          do {
            cVar2 = local_262[lVar19];
            local_264 = 0x100;
            lVar15 = 0;
            do {
              bVar25 = *(bool *)((long)&local_264 + lVar15);
              out_sha_bytes._0_8_ = out_sha_bytes + 0x10;
              out_sha_bytes[8] = '\0';
              out_sha_bytes[9] = '\0';
              out_sha_bytes[10] = '\0';
              out_sha_bytes[0xb] = '\0';
              out_sha_bytes[0xc] = '\0';
              out_sha_bytes[0xd] = '\0';
              out_sha_bytes[0xe] = '\0';
              out_sha_bytes[0xf] = '\0';
              out_sha_bytes[0x10] = '\0';
              value_suffix = 0;
              settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_red;
              settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header;
              settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              settings.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_red;
              settings.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              settings.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &settings.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header;
              settings.command_line_options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              settings.rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              settings.rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              settings.rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &settings.rw_settings._M_t._M_impl.super__Rb_tree_header._M_header;
              settings.rw_settings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              settings.ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              settings.ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              settings.ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &settings.ro_config._M_t._M_impl.super__Rb_tree_header._M_header;
              settings.ro_config._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              pcVar9 = "server";
              if (bVar25 != false) {
                pcVar9 = "wallet";
              }
              out_sha_hex._M_dataplus._M_p = (pointer)&out_sha_hex.field_2;
              pcVar21 = "";
              if (bVar25 != false) {
                pcVar21 = "";
              }
              settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              settings.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   settings.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
              settings.rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   settings.rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              settings.ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   settings.ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              std::__cxx11::string::_M_construct<char_const*>((string *)&out_sha_hex,pcVar9,pcVar21)
              ;
              push_values.value_suffix = &value_suffix;
              push_values.desc = (string *)out_sha_bytes;
              push_values.name = &out_sha_hex;
              if (cVar2 != '\0') {
                ::UniValue::UniValue<const_char_(&)[7],_char[7],_true>
                          ((SettingsValue *)&__str,(char (*) [7])0xee8685);
                pmVar16 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                          ::operator[](&settings.forced_settings,&out_sha_hex);
                pmVar16->typ = (VType)__str._M_dataplus._M_p;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&pmVar16->val,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &__str._M_string_length);
                auStack_1a8._0_8_ =
                     (pmVar16->keys).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_1b8._0_8_ =
                     (pmVar16->keys).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_1b8._8_8_ =
                     (pmVar16->keys).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                (pmVar16->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_168.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                (pmVar16->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_168.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                (pmVar16->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_168.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_168.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_168.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_168.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1b8);
                auStack_1a8._0_8_ =
                     (pmVar16->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
                local_1b8._0_8_ =
                     (pmVar16->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                local_1b8._8_8_ =
                     (pmVar16->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                (pmVar16->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_150.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_start;
                (pmVar16->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_150.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                (pmVar16->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_150.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_150.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_150.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_150.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                          ((vector<UniValue,_std::allocator<UniValue>_> *)local_1b8);
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_150);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_168);
                if ((undefined1 *)__str._M_string_length != (undefined1 *)((long)&__str.field_2 + 8)
                   ) {
                  operator_delete((void *)__str._M_string_length,__str.field_2._8_8_ + 1);
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1b8," ",&out_sha_hex);
                pbVar17 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1b8,"=forced");
                __str._M_dataplus._M_p = (pbVar17->_M_dataplus)._M_p;
                paVar20 = &pbVar17->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p == paVar20) {
                  __str.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
                  __str.field_2._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
                  __str._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  __str.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
                }
                __str._M_string_length = pbVar17->_M_string_length;
                (pbVar17->_M_dataplus)._M_p = (pointer)paVar20;
                pbVar17->_M_string_length = 0;
                (pbVar17->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          out_sha_bytes,__str._M_dataplus._M_p,__str._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p != paVar1) {
                  operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
                }
                if ((pointer)local_1b8._0_8_ != (pointer)auStack_1a8) {
                  operator_delete((void *)local_1b8._0_8_,(ulong)(auStack_1a8._0_8_ + 1));
                }
              }
              lVar24 = 0;
              do {
                AVar3 = *(Action *)((long)local_1d8 + lVar24);
                __str.field_2._M_allocated_capacity._0_2_ = 0x2d;
                __str._M_string_length = 1;
                __str._M_dataplus._M_p = (pointer)paVar1;
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          ::operator[](&settings.command_line_options,&out_sha_hex);
                test_method::anon_class_24_3_9e0baaf7::operator()::anon_class_24_3_f552ebe0::
                operator()(&push_values,AVar3,"a",(string *)&__str,pmVar13);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p != paVar1) {
                  operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
                }
                lVar24 = lVar24 + 4;
              } while (lVar24 != 0xc);
              lVar24 = 0;
              do {
                AVar3 = *(Action *)((long)local_1c8 + lVar24);
                if (AVar3 + ~SECTION_NEGATE < 0xfffffffe) {
                  __str._M_string_length = 0;
                  __str.field_2._M_allocated_capacity =
                       __str.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  local_1b8._0_8_ = auStack_1a8;
                  local_1b8._8_8_ = (pointer)0x0;
                  auStack_1a8._0_8_ = auStack_1a8._0_8_ & 0xffffffffffffff00;
                  __str._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  __str._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&__str,local_260._M_dataplus._M_p,
                             local_260._M_dataplus._M_p + local_260._M_string_length);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&__str,".");
                  local_1b8._0_8_ = auStack_1a8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_1b8,local_260._M_dataplus._M_p,
                             local_260._M_dataplus._M_p + local_260._M_string_length);
                }
                this_00 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                          ::operator[](&settings.ro_config,(key_type *)local_1b8);
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          ::operator[](this_00,&out_sha_hex);
                test_method::anon_class_24_3_9e0baaf7::operator()::anon_class_24_3_f552ebe0::
                operator()(&push_values,AVar3,"c",(string *)&__str,pmVar13);
                if ((pointer)local_1b8._0_8_ != (pointer)auStack_1a8) {
                  operator_delete((void *)local_1b8._0_8_,(ulong)(auStack_1a8._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p != paVar1) {
                  operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
                }
                lVar24 = lVar24 + 4;
              } while (lVar24 != 0xc);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     out_sha_bytes," || ");
              pvVar23 = (iterator)0x0;
              common::GetSetting((SettingsValue *)&__str,&settings,&local_260,&out_sha_hex,bVar25,
                                 false,false);
              ::UniValue::write_abi_cxx11_
                        ((UniValue *)local_1b8,(int)(SettingsValue *)&__str,(void *)0x0,0);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        out_sha_bytes,(char *)local_1b8._0_8_,local_1b8._8_8_);
              if ((pointer)local_1b8._0_8_ != (pointer)auStack_1a8) {
                operator_delete((void *)local_1b8._0_8_,(ulong)(auStack_1a8._0_8_ + 1));
              }
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_150);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_168);
              if ((undefined1 *)__str._M_string_length != (undefined1 *)((long)&__str.field_2 + 8))
              {
                operator_delete((void *)__str._M_string_length,__str.field_2._8_8_ + 1);
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     out_sha_bytes," |");
              in_R8 = (iterator)(ulong)bVar25;
              common::GetSettingsList
                        ((vector<UniValue,_std::allocator<UniValue>_> *)local_1b8,&settings,
                         &local_260,&out_sha_hex,bVar25);
              uVar6 = local_1b8._8_8_;
              for (pUVar22 = (pointer)local_1b8._0_8_; pUVar22 != (pointer)uVar6;
                  pUVar22 = pUVar22 + 1) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       out_sha_bytes," ");
                ::UniValue::write_abi_cxx11_((SettingsValue *)&__str,(int)pUVar22,(void *)0x0,0);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          out_sha_bytes,__str._M_dataplus._M_p,__str._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p != paVar1) {
                  operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
                }
              }
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                        ((vector<UniValue,_std::allocator<UniValue>_> *)local_1b8);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     out_sha_bytes," |");
              bVar25 = common::OnlyHasDefaultSectionSetting(&settings,&local_260,&out_sha_hex);
              if (bVar25) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       out_sha_bytes," ignored");
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     out_sha_bytes,"\n");
              CSHA256::Write(&out_sha.sha,(uchar *)out_sha_bytes._0_8_,out_sha_bytes._8_8_);
              if (local_300 != (FILE *)0x0) {
                local_290 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
                ;
                local_288 = "";
                local_2a8._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                local_2a8._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                file.m_end = (iterator)0xf4;
                file.m_begin = (iterator)&local_290;
                msg.m_end = pvVar23;
                msg.m_begin = in_R8;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
                           (size_t)local_2a8,msg);
                _cVar26 = 0x62b20a;
                sVar14 = fwrite((void *)out_sha_bytes._0_8_,1,out_sha_bytes._8_8_,local_300);
                local_1b8[0] = sVar14 == out_sha_bytes._8_8_;
                local_1b8._8_8_ = (pointer)0x0;
                auStack_1a8._0_8_ = (pointer)0x0;
                local_2b8 = "fwrite(desc.data(), 1, desc.size(), out_file) == desc.size()";
                local_2b0 = "";
                __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
                __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
                __str.field_2._M_allocated_capacity =
                     (size_type)boost::unit_test::lazy_ostream::inst;
                __str.field_2._8_8_ = &local_2b8;
                local_2c8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
                ;
                local_2c0 = "";
                in_R8 = (iterator)0x2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_1b8,(lazy_ostream *)&__str,2,0,WARN,_cVar26,
                           (size_t)&local_2c8,0xf4);
                boost::detail::shared_count::~shared_count((shared_count *)auStack_1a8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)out_sha_hex._M_dataplus._M_p != &out_sha_hex.field_2) {
                operator_delete(out_sha_hex._M_dataplus._M_p,
                                out_sha_hex.field_2._M_allocated_capacity + 1);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
              ::~_Rb_tree(&settings.ro_config._M_t);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              ::~_Rb_tree(&settings.rw_settings._M_t);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
              ::~_Rb_tree(&settings.command_line_options._M_t);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                           *)&settings);
              if ((uchar *)out_sha_bytes._0_8_ != out_sha_bytes + 0x10) {
                operator_delete((void *)out_sha_bytes._0_8_,
                                CONCAT71(out_sha_bytes._17_7_,out_sha_bytes[0x10]) + 1);
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != 2);
            lVar19 = lVar19 + 1;
          } while (lVar19 != 2);
        }
        lVar19 = 0;
        do {
          iVar7 = *(int *)((long)local_1c8 + lVar19);
          iVar8 = iVar7 + 1;
          if (2 < iVar7 - 1U) {
            iVar8 = 1;
          }
          *(int *)((long)local_1c8 + lVar19) = iVar8;
        } while ((iVar7 == 4) && (bVar25 = lVar19 != 8, lVar19 = lVar19 + 4, bVar25));
        lVar19 = 0;
        iVar8 = -1;
      } while (iVar7 != 4);
    }
    pvVar23 = (iterator)0x1;
    lVar19 = 0;
    do {
      iVar7 = *(int *)((long)local_1d8 + lVar19);
      *(uint *)((long)local_1d8 + lVar19) = (iVar7 == 1) + 1;
      if (iVar7 != 2) break;
      bVar25 = lVar19 != 8;
      lVar19 = lVar19 + 4;
    } while (bVar25);
    lVar19 = 0;
    iVar8 = -1;
  } while (iVar7 != 2);
  if ((local_300 == (FILE *)0x0) || (iVar8 = fclose(local_300), iVar8 == 0)) {
    output.m_size = 0x20;
    output.m_data = out_sha_bytes;
    CHash256::Finalize(&out_sha,output);
    s.m_size = 0x20;
    s.m_data = out_sha_bytes;
    HexStr_abi_cxx11_(&out_sha_hex,s);
    local_2d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
    ;
    local_2d0 = "";
    local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x10a;
    file_00.m_begin = (iterator)&local_2d8;
    msg_00.m_end = pvVar23;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2e8,
               msg_00);
    local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
    local_1b8._0_8_ = &PTR__lazy_ostream_01388f08;
    auStack_1a8._0_8_ = boost::unit_test::lazy_ostream::inst;
    auStack_1a8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&out_sha_hex,
                       "79db02d74e3e193196541b67c068b40ebd0c124a24b3ecbe9cbf7e85b1c4ba7a");
    push_values.value_suffix = (int *)CONCAT71(push_values.value_suffix._1_7_,iVar8 == 0);
    push_values.desc = (string *)0x0;
    push_values.name = (string *)0x0;
    local_290 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
    ;
    local_288 = "";
    settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00
    ;
    settings.forced_settings._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01388fc8;
    settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_2a8;
    local_2b8 = "79db02d74e3e193196541b67c068b40ebd0c124a24b3ecbe9cbf7e85b1c4ba7a";
    __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
    __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013898d8;
    __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    __str.field_2._8_8_ = &local_2b8;
    local_2a8._0_8_ = &out_sha_hex;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&push_values,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xe3628d,
               (size_t)&local_290,0x10a,&settings,
               "\"79db02d74e3e193196541b67c068b40ebd0c124a24b3ecbe9cbf7e85b1c4ba7a\"",
               (SettingsValue *)&__str);
    boost::detail::shared_count::~shared_count((shared_count *)&push_values.name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out_sha_hex._M_dataplus._M_p != &out_sha_hex.field_2) {
      operator_delete(out_sha_hex._M_dataplus._M_p,out_sha_hex.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
      return;
    }
  }
  else {
    psVar10 = (system_error *)__cxa_allocate_exception(0x20);
    puVar18 = (uint *)__errno_location();
    uVar4 = *puVar18;
    peVar12 = (error_category *)std::_V2::generic_category();
    __ec._4_4_ = 0;
    __ec._M_value = uVar4;
    __ec._M_cat = peVar12;
    std::system_error::system_error(psVar10,__ec,"fclose failed");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
      __cxa_throw(psVar10,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
LAB_0062bb4f:
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(Merge, MergeTestingSetup)
{
    CHash256 out_sha;
    FILE* out_file = nullptr;
    if (const char* out_path = getenv("SETTINGS_MERGE_TEST_OUT")) {
        out_file = fsbridge::fopen(out_path, "w");
        if (!out_file) throw std::system_error(errno, std::generic_category(), "fopen failed");
    }

    const std::string& network = ChainTypeToString(ChainType::MAIN);
    ForEachMergeSetup([&](const ActionList& arg_actions, const ActionList& conf_actions, bool force_set,
                          bool ignore_default_section_config) {
        std::string desc;
        int value_suffix = 0;
        common::Settings settings;

        const std::string& name = ignore_default_section_config ? "wallet" : "server";
        auto push_values = [&](Action action, const char* value_prefix, const std::string& name_prefix,
                               std::vector<common::SettingsValue>& dest) {
            if (action == SET || action == SECTION_SET) {
                for (int i = 0; i < 2; ++i) {
                    dest.emplace_back(value_prefix + ToString(++value_suffix));
                    desc += " " + name_prefix + name + "=" + dest.back().get_str();
                }
            } else if (action == NEGATE || action == SECTION_NEGATE) {
                dest.emplace_back(false);
                desc += " " + name_prefix + "no" + name;
            }
        };

        if (force_set) {
            settings.forced_settings[name] = "forced";
            desc += " " + name + "=forced";
        }
        for (Action arg_action : arg_actions) {
            push_values(arg_action, "a", "-", settings.command_line_options[name]);
        }
        for (Action conf_action : conf_actions) {
            bool use_section = conf_action == SECTION_SET || conf_action == SECTION_NEGATE;
            push_values(conf_action, "c", use_section ? network + "." : "",
                settings.ro_config[use_section ? network : ""][name]);
        }

        desc += " || ";
        desc += GetSetting(settings, network, name, ignore_default_section_config, /*ignore_nonpersistent=*/false, /*get_chain_type=*/false).write();
        desc += " |";
        for (const auto& s : GetSettingsList(settings, network, name, ignore_default_section_config)) {
            desc += " ";
            desc += s.write();
        }
        desc += " |";
        if (OnlyHasDefaultSectionSetting(settings, network, name)) desc += " ignored";
        desc += "\n";

        out_sha.Write(MakeUCharSpan(desc));
        if (out_file) {
            BOOST_REQUIRE(fwrite(desc.data(), 1, desc.size(), out_file) == desc.size());
        }
    });

    if (out_file) {
        if (fclose(out_file)) throw std::system_error(errno, std::generic_category(), "fclose failed");
        out_file = nullptr;
    }

    unsigned char out_sha_bytes[CSHA256::OUTPUT_SIZE];
    out_sha.Finalize(out_sha_bytes);
    std::string out_sha_hex = HexStr(out_sha_bytes);

    // If check below fails, should manually dump the results with:
    //
    //   SETTINGS_MERGE_TEST_OUT=results.txt ./test_bitcoin --run_test=settings_tests/Merge
    //
    // And verify diff against previous results to make sure the changes are expected.
    //
    // Results file is formatted like:
    //
    //   <input> || GetSetting() | GetSettingsList() | OnlyHasDefaultSectionSetting()
    BOOST_CHECK_EQUAL(out_sha_hex, "79db02d74e3e193196541b67c068b40ebd0c124a24b3ecbe9cbf7e85b1c4ba7a");
}